

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

int envy_bios_parse_mem_train_ptrn(envy_bios *bios)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  envy_bios_mem_train_ptrn_entry *peVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  uint8_t *puVar12;
  int iVar13;
  byte *pbVar14;
  ulong uVar15;
  int iVar16;
  
  uVar2 = (bios->mem).train_ptrn.offset;
  iVar3 = 0;
  if (uVar2 != 0) {
    uVar6 = bios->length;
    if (uVar2 < uVar6) {
      (bios->mem).train_ptrn.version = bios->data[(uint)uVar2];
      iVar16 = 0;
    }
    else {
      (bios->mem).train_ptrn.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar2 = (bios->mem).train_ptrn.offset;
      uVar6 = bios->length;
      iVar16 = -0xe;
    }
    uVar15 = (ulong)uVar2;
    lVar7 = uVar15 + 1;
    if ((uint)lVar7 < uVar6) {
      (bios->mem).train_ptrn.hlen = bios->data[lVar7];
      iVar13 = 0;
    }
    else {
      (bios->mem).train_ptrn.hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar7);
      uVar15 = (ulong)(bios->mem).train_ptrn.offset;
      uVar6 = bios->length;
      iVar13 = -0xe;
    }
    lVar7 = uVar15 + 2;
    if ((uint)lVar7 < uVar6) {
      (bios->mem).train_ptrn.rlen = bios->data[lVar7];
      iVar4 = 0;
    }
    else {
      (bios->mem).train_ptrn.rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar7);
      uVar15 = (ulong)(bios->mem).train_ptrn.offset;
      uVar6 = bios->length;
      iVar4 = -0xe;
    }
    uVar10 = (uint)uVar15;
    lVar7 = uVar15 + 3;
    if ((uint)lVar7 < uVar6) {
      (bios->mem).train_ptrn.subentrylen = bios->data[lVar7];
      iVar5 = 0;
    }
    else {
      (bios->mem).train_ptrn.subentrylen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar7);
      uVar10 = (uint)(bios->mem).train_ptrn.offset;
      uVar6 = bios->length;
      iVar5 = -0xe;
    }
    if ((uint)((ulong)uVar10 + 4) < uVar6) {
      (bios->mem).train_ptrn.entriesnum = bios->data[(ulong)uVar10 + 4];
      iVar9 = 0;
    }
    else {
      (bios->mem).train_ptrn.entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar9 = -0xe;
    }
    (bios->mem).train_ptrn.subentries = '\x01';
    iVar3 = -0xe;
    if ((((iVar13 == 0 && iVar16 == 0) && iVar4 == 0) && iVar5 == 0) && iVar9 == 0) {
      envy_bios_block(bios,(uint)(bios->mem).train_ptrn.offset,
                      (uint)(bios->mem).train_ptrn.entriesnum * (uint)(bios->mem).train_ptrn.rlen +
                      (uint)(bios->mem).train_ptrn.hlen,"MEM TRAIN PATTERN",-1);
      bVar1 = (bios->mem).train_ptrn.entriesnum;
      peVar8 = (envy_bios_mem_train_ptrn_entry *)calloc((ulong)bVar1,6);
      (bios->mem).train_ptrn.entries = peVar8;
      if (peVar8 == (envy_bios_mem_train_ptrn_entry *)0x0) {
        iVar3 = -0xc;
      }
      else {
        if (bVar1 != 0) {
          lVar7 = 2;
          uVar15 = 0;
          do {
            peVar8 = (bios->mem).train_ptrn.entries;
            uVar6 = (int)uVar15 *
                    ((uint)(bios->mem).train_ptrn.subentrylen *
                     (uint)(bios->mem).train_ptrn.subentries + (uint)(bios->mem).train_ptrn.rlen) +
                    (uint)(bios->mem).train_ptrn.hlen + (uint)(bios->mem).train_ptrn.offset;
            *(short *)((long)peVar8 + lVar7 + -2) = (short)uVar6;
            if ((uVar6 & 0xffff) < bios->length) {
              pbVar14 = bios->data + (uVar6 & 0xffff);
            }
            else {
              pbVar14 = (byte *)((long)&peVar8->offset + lVar7);
              *(undefined1 *)((long)&peVar8->offset + lVar7) = 0;
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
              uVar6 = (uint)*(ushort *)((long)peVar8 + lVar7 + -2);
            }
            *(byte *)((long)&peVar8->offset + lVar7) = *pbVar14 & 0x3f;
            lVar11 = (ulong)(uVar6 & 0xffff) + 1;
            if ((uint)lVar11 < bios->length) {
              *(uint8_t *)((long)&peVar8->offset + lVar7 + 1) = bios->data[lVar11];
            }
            else {
              *(undefined1 *)((long)&peVar8->offset + lVar7 + 1) = 0;
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            }
            if ((bios->mem).train_ptrn.rlen < 4) {
              (&peVar8->bits)[lVar7] = '\0';
              (&peVar8->modulo)[lVar7] = (uint8_t)uVar15;
            }
            else {
              uVar2 = *(ushort *)((long)peVar8 + lVar7 + -2);
              if ((uint)((ulong)uVar2 + 2) < bios->length) {
                puVar12 = bios->data + (ulong)uVar2 + 2;
              }
              else {
                puVar12 = &peVar8->bits + lVar7;
                *puVar12 = 0;
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                uVar2 = *(ushort *)((long)peVar8 + lVar7 + -2);
              }
              (&peVar8->bits)[lVar7] = (*puVar12 & 7) == 2;
              if ((uint)((ulong)uVar2 + 3) < bios->length) {
                (&peVar8->modulo)[lVar7] = bios->data[(ulong)uVar2 + 3];
              }
              else {
                (&peVar8->modulo)[lVar7] = '\0';
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
              }
            }
            uVar15 = uVar15 + 1;
            lVar7 = lVar7 + 6;
          } while (uVar15 < (bios->mem).train_ptrn.entriesnum);
        }
        (bios->mem).train_ptrn.valid = '\x01';
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int
envy_bios_parse_mem_train_ptrn(struct envy_bios *bios) {
	struct envy_bios_mem_train_ptrn *mtp = &bios->mem.train_ptrn;
	if (!mtp->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, mtp->offset, &mtp->version);
	err |= bios_u8(bios, mtp->offset+1, &mtp->hlen);
	err |= bios_u8(bios, mtp->offset+2, &mtp->rlen);
	err |= bios_u8(bios, mtp->offset+3, &mtp->subentrylen);
	err |= bios_u8(bios, mtp->offset+4, &mtp->entriesnum);
	mtp->subentries = 1;
	if (err)
		return -EFAULT;

	envy_bios_block(bios, mtp->offset,
			mtp->hlen + mtp->rlen * mtp->entriesnum,
			"MEM TRAIN PATTERN", -1);

	mtp->entries = calloc(mtp->entriesnum, sizeof *mtp->entries);
	if (!mtp->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < mtp->entriesnum; i++) {
		struct envy_bios_mem_train_ptrn_entry *entry = &mtp->entries[i];
		entry->offset = mtp->offset + mtp->hlen +
				((mtp->rlen + mtp->subentries * mtp->subentrylen) * i);
		err |= bios_u8(bios, entry->offset, &entry->bits);
		entry->bits &= 0x3f;
		err |= bios_u8(bios, entry->offset+1, &entry->modulo);
		if (mtp->rlen >= 4) {
			err |= bios_u8(bios, entry->offset+2, &entry->indirect);
			entry->indirect = (entry->indirect & 0x7) == 0x2;
			err |= bios_u8(bios, entry->offset+3, &entry->indirect_entry);
		} else {
			entry->indirect = 0;
			entry->indirect_entry = i;
		}
	}
	mtp->valid = 1;
	return 0;
}